

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmm.c
# Opt level: O2

int32 hmm_vit_eval_anytopo(hmm_t *hmm)

{
  hmm_state_t *phVar1;
  uint8 uVar2;
  byte bVar3;
  hmm_context_t *phVar4;
  int32 *piVar5;
  hmm_state_t *phVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  int32 iVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  
  phVar4 = hmm->ctx;
  uVar2 = hmm->mpx;
  if (uVar2 == '\0') {
    iVar11 = (hmm->s).ssid;
  }
  else {
    iVar11 = *(hmm->s).mpx_ssid;
  }
  if (iVar11 == -1) {
    iVar12 = -0x38000000;
  }
  else {
    iVar12 = phVar4->senscore[*phVar4->sseq[iVar11]];
  }
  phVar1 = hmm->state;
  piVar5 = phVar4->st_sen_scr;
  *piVar5 = iVar12 + hmm->state[0].score;
  phVar6 = hmm->state;
  for (uVar14 = 1; phVar6 = phVar6 + 1, bVar3 = hmm->n_emit_state, uVar14 < bVar3;
      uVar14 = uVar14 + 1) {
    if (uVar2 == '\0') {
      iVar12 = (hmm->s).ssid;
    }
    else {
      iVar12 = (hmm->s).mpx_ssid[uVar14];
    }
    if (iVar12 == -1) {
      iVar12 = -0x38000000;
    }
    else {
      iVar12 = phVar4->senscore[phVar4->sseq[iVar12][uVar14]];
    }
    iVar12 = iVar12 + phVar6->score;
    if (iVar12 < -0x37ffffff) {
      iVar12 = -0x38000000;
    }
    piVar5[uVar14] = iVar12;
  }
  iVar11 = -0x38000000;
  uVar14 = 0xffffffff;
  uVar13 = bVar3 - 1;
  for (uVar7 = uVar13; -1 < (int)uVar7; uVar7 = uVar7 - 1) {
    if ((-0x38000000 < phVar4->tp[hmm->tmatid][uVar7][(uint)bVar3]) &&
       (iVar10 = phVar4->tp[hmm->tmatid][uVar7][(uint)bVar3] + piVar5[uVar7], iVar11 < iVar10)) {
      uVar14 = (ulong)uVar7;
      iVar11 = iVar10;
    }
  }
  (hmm->out).score = iVar11;
  if (-1 < (int)uVar14) {
    (hmm->out).history = hmm->state[uVar14].history;
  }
  do {
    if ((int)uVar13 < 0) {
      hmm->bestscore = iVar11;
      return iVar11;
    }
    uVar14 = (ulong)uVar13;
    iVar10 = phVar4->tp[hmm->tmatid][uVar14][uVar14];
    iVar8 = -0x38000000;
    if (-0x38000000 < iVar10) {
      iVar8 = iVar10 + phVar4->st_sen_scr[uVar14];
    }
    uVar9 = 0xffffffff;
    uVar15 = uVar14;
    while (0 < (int)uVar15) {
      uVar15 = uVar15 - 1;
      iVar10 = phVar4->tp[hmm->tmatid][uVar15 & 0xffffffff][uVar14];
      if ((-0x38000000 < iVar10) &&
         (iVar10 = iVar10 + phVar4->st_sen_scr[uVar15 & 0xffffffff], iVar8 < iVar10)) {
        uVar9 = uVar15 & 0xffffffff;
        iVar8 = iVar10;
      }
    }
    if (uVar14 == 0) {
      phVar1->score = iVar8;
      phVar6 = hmm->state;
      if (-1 < (int)uVar9) goto LAB_0010f10c;
    }
    else {
      phVar1[uVar14].score = iVar8;
      if (-1 < (int)uVar9) {
        phVar6 = phVar1 + uVar14;
LAB_0010f10c:
        phVar6->history = hmm->state[uVar9].history;
        if (uVar2 != '\0') {
          (hmm->s).mpx_ssid[uVar14] = (hmm->s).mpx_ssid[uVar9];
        }
      }
    }
    if (iVar11 <= iVar8) {
      iVar11 = iVar8;
    }
    uVar13 = uVar13 - 1;
  } while( true );
}

Assistant:

static int32
hmm_vit_eval_anytopo(hmm_t * hmm)
{
    hmm_context_t *ctx = hmm->ctx;
    int32 to, from, bestfrom;
    int32 newscr, scr, bestscr;
    int final_state;

    /* Compute previous state-score + observation output prob for each emitting state */
    ctx->st_sen_scr[0] = hmm_in_score(hmm) + hmm_senscr(hmm, 0);
    for (from = 1; from < hmm_n_emit_state(hmm); ++from) {
        if ((ctx->st_sen_scr[from] =
             hmm_score(hmm, from) + hmm_senscr(hmm, from)) < WORST_SCORE)
            ctx->st_sen_scr[from] = WORST_SCORE;
    }

    /* FIXME/TODO: Use the BLAS for all this. */
    /* Evaluate final-state first, which does not have a self-transition */
    final_state = hmm_n_emit_state(hmm);
    to = final_state;
    scr = WORST_SCORE;
    bestfrom = -1;
    for (from = to - 1; from >= 0; --from) {
        if ((hmm_tprob(hmm, from, to) > WORST_SCORE) &&
            ((newscr = ctx->st_sen_scr[from]
              + hmm_tprob(hmm, from, to)) > scr)) {
            scr = newscr;
            bestfrom = from;
        }
    }
    hmm_out_score(hmm) = scr;
    if (bestfrom >= 0)
        hmm_out_history(hmm) = hmm_history(hmm, bestfrom);
    bestscr = scr;

    /* Evaluate all other states, which might have self-transitions */
    for (to = final_state - 1; to >= 0; --to) {
        /* Score from self-transition, if any */
        scr =
            (hmm_tprob(hmm, to, to) > WORST_SCORE)
            ? ctx->st_sen_scr[to] + hmm_tprob(hmm, to, to)
            : WORST_SCORE;

        /* Scores from transitions from other states */
        bestfrom = -1;
        for (from = to - 1; from >= 0; --from) {
            if ((hmm_tprob(hmm, from, to) > WORST_SCORE) &&
                ((newscr = ctx->st_sen_scr[from]
                  + hmm_tprob(hmm, from, to)) > scr)) {
                scr = newscr;
                bestfrom = from;
            }
        }

        /* Update new result for state to */
        if (to == 0) {
            hmm_in_score(hmm) = scr;
            if (bestfrom >= 0)
                hmm_in_history(hmm) = hmm_history(hmm, bestfrom);
        }
        else {
            hmm_score(hmm, to) = scr;
            if (bestfrom >= 0)
                hmm_history(hmm, to) = hmm_history(hmm, bestfrom);
        }
        if (bestfrom >= 0 && hmm_is_mpx(hmm))
            hmm->s.mpx_ssid[to] = hmm->s.mpx_ssid[bestfrom];

        if (bestscr < scr)
            bestscr = scr;
    }

    hmm_bestscore(hmm) = bestscr;
    return bestscr;
}